

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Costs.cpp
# Opt level: O2

void __thiscall Costs::fillCoeffsAG(Costs *this,double **coeffs,double *sumY,uint n)

{
  double *pdVar1;
  uint T;
  double *gtT;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  Costs *this_00;
  
  this_00 = (Costs *)((ulong)(n + 1) << 3);
  gtT = (double *)operator_new__((ulong)this_00);
  uVar2 = 2;
  uVar3 = 1;
  while (uVar3 < n - 1) {
    iVar5 = (int)uVar2;
    gtT[uVar3 + 1] = 0.0;
    uVar4 = 2;
    for (; uVar2 < n; uVar2 = uVar2 + 1) {
      gtT[uVar2 + 1] =
           ((double)(uVar4 - 1) * gtT[uVar2] + (sumY[uVar2] - sumY[uVar3])) / (double)uVar4;
      uVar4 = uVar4 + 1;
    }
    linReg(this_00,coeffs[uVar3],gtT,(uint)uVar3,n);
    uVar2 = (ulong)(iVar5 + 1);
    uVar3 = uVar3 + 1;
  }
  pdVar1 = coeffs[n - 1];
  pdVar1[2] = 0.0;
  pdVar1[3] = 0.0;
  *pdVar1 = 0.0;
  pdVar1[1] = 0.0;
  pdVar1 = coeffs[n];
  pdVar1[2] = 0.0;
  pdVar1[3] = 0.0;
  *pdVar1 = 0.0;
  pdVar1[1] = 0.0;
  operator_delete__(gtT);
  return;
}

Assistant:

void Costs::fillCoeffsAG(double** coeffs, double* sumY, unsigned int n)
{
  ///fill coeffs[t] = CoeffsAG[t] for t = 1 to n-1 (0 and n un-necessary)
  double* gtT = new double[n + 1];
  for(unsigned int t = 1; t < (n - 1); t++) /// Fill coeffs[t] using gtT[t + 1]... gtT[n]
  {
    gtT[t + 1] = 0;
    for(unsigned int T = t + 1; T < n; T++) //update gtT from gtT[t + 2] to gtT[n-1]
    {
      gtT[T + 1] = ((T-t)*gtT[T] + (sumY[T]-sumY[t]))/(T-t+1);
    }
    linReg(coeffs[t], gtT, t, n); //consider gtT only from t + 1 to n in this function
    //std::cout << t << " : " << coeffs[t][0] << " "<< coeffs[t][1] << " "<< coeffs[t][2] << " "<< coeffs[t][3] << std::endl;
  }
  coeffs[n - 1][0] = 0;
  coeffs[n - 1][1] = 0;
  coeffs[n - 1][2] = 0;
  coeffs[n - 1][3] = 0;

  coeffs[n][0] = 0;
  coeffs[n][1] = 0;
  coeffs[n][2] = 0;
  coeffs[n][3] = 0;

  delete [] gtT;
  gtT = NULL;
}